

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_service.hpp
# Opt level: O2

int __thiscall
asio::experimental::detail::channel_service<asio::detail::null_mutex>::shutdown
          (channel_service<asio::detail::null_mutex> *this,int __fd,int __how)

{
  base_implementation_type *pbVar1;
  int extraout_EAX;
  base_implementation_type **ppbVar2;
  scoped_lock lock;
  op_queue<asio::experimental::detail::channel_operation> ops;
  scoped_lock<asio::detail::posix_mutex> local_38;
  op_queue<asio::experimental::detail::channel_operation> local_28;
  
  local_28.front_ = (channel_operation *)0x0;
  local_28.back_ = (channel_operation *)0x0;
  local_38.mutex_ = &this->mutex_;
  pthread_mutex_lock((pthread_mutex_t *)local_38.mutex_);
  local_38.locked_ = true;
  ppbVar2 = &this->impl_list_;
  while (pbVar1 = *ppbVar2, pbVar1 != (base_implementation_type *)0x0) {
    asio::detail::op_queue<asio::experimental::detail::channel_operation>::
    push<asio::experimental::detail::channel_operation>(&local_28,&pbVar1->waiters_);
    ppbVar2 = &pbVar1->next_;
  }
  asio::detail::scoped_lock<asio::detail::posix_mutex>::~scoped_lock(&local_38);
  asio::detail::op_queue<asio::experimental::detail::channel_operation>::~op_queue(&local_28);
  return extraout_EAX;
}

Assistant:

inline void channel_service<Mutex>::shutdown()
{
  // Abandon all pending operations.
  asio::detail::op_queue<channel_operation> ops;
  asio::detail::mutex::scoped_lock lock(mutex_);
  base_implementation_type* impl = impl_list_;
  while (impl)
  {
    ops.push(impl->waiters_);
    impl = impl->next_;
  }
}